

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_panel_layout(nk_context *ctx,nk_window *win,float height,int cols)

{
  uint uVar1;
  nk_color c;
  nk_panel *pnVar2;
  float fVar3;
  float fVar4;
  nk_rect rect;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4598,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4599,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  pnVar2 = win->layout;
  uVar1 = pnVar2->flags;
  if ((uVar1 >> 0xe & 1) != 0) {
    __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x45a9,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  if ((uVar1 >> 0xc & 1) == 0) {
    if ((uVar1 >> 0xd & 1) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x45ab,
                    "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)"
                   );
    }
    c = (ctx->style).window.background;
    fVar4 = (ctx->style).window.spacing.y;
    (pnVar2->row).index = 0;
    fVar3 = (pnVar2->row).height + pnVar2->at_y;
    pnVar2->at_y = fVar3;
    (pnVar2->row).columns = cols;
    fVar4 = fVar4 + height;
    (pnVar2->row).height = fVar4;
    (pnVar2->row).item_offset = 0.0;
    if ((uVar1 >> 10 & 1) == 0) {
      return;
    }
    rect.y = fVar3 + -1.0;
    rect.x = (win->bounds).x;
    rect.h = fVar4 + 1.0;
    rect.w = (win->bounds).w;
    nk_fill_rect(&win->buffer,rect,0.0,c);
    return;
  }
  __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x45aa,
                "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)");
}

Assistant:

NK_INTERN void
nk_panel_layout(const struct nk_context *ctx, struct nk_window *win,
    float height, int cols)
{
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;

    struct nk_vec2 item_spacing;
    struct nk_color color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* prefetch some configuration data */
    layout = win->layout;
    style = &ctx->style;
    out = &win->buffer;
    color = style->window.background;
    item_spacing = style->window.spacing;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* update the current row and set the current row layout */
    layout->row.index = 0;
    layout->at_y += layout->row.height;
    layout->row.columns = cols;
    layout->row.height = height + item_spacing.y;
    layout->row.item_offset = 0;
    if (layout->flags & NK_WINDOW_DYNAMIC) {
        /* draw background for dynamic panels */
        struct nk_rect background;
        background.x = win->bounds.x;
        background.w = win->bounds.w;
        background.y = layout->at_y - 1.0f;
        background.h = layout->row.height + 1.0f;
        nk_fill_rect(out, background, 0, color);
    }
}